

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogStream.h
# Opt level: O2

void __thiscall Assimp::FileLogStream::FileLogStream(FileLogStream *this,char *file,IOSystem *io)

{
  int iVar1;
  undefined4 extraout_var;
  IOStream *pIVar2;
  DefaultIOSystem FileSystem;
  IOSystem local_28;
  
  (this->super_LogStream)._vptr_LogStream = (_func_int **)&PTR__FileLogStream_00244730;
  this->m_pStream = (IOStream *)0x0;
  if ((file != (char *)0x0) && (*file != '\0')) {
    if (io == (IOSystem *)0x0) {
      local_28.m_pathStack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28.m_pathStack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_28.m_pathStack.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28._vptr_IOSystem = (_func_int **)&PTR__IOSystem_00244bf8;
      pIVar2 = DefaultIOSystem::Open((DefaultIOSystem *)&local_28,file,"wt");
      this->m_pStream = pIVar2;
      IOSystem::~IOSystem(&local_28);
    }
    else {
      iVar1 = (*io->_vptr_IOSystem[4])(io,file,"wt");
      this->m_pStream = (IOStream *)CONCAT44(extraout_var,iVar1);
    }
  }
  return;
}

Assistant:

inline FileLogStream::FileLogStream( const char* file, IOSystem* io ) :
    m_pStream(NULL)
{
    if ( !file || 0 == *file )
        return;

    // If no IOSystem is specified: take a default one
    if (!io)
    {
        DefaultIOSystem FileSystem;
        m_pStream = FileSystem.Open( file, "wt");
    }
    else m_pStream = io->Open( file, "wt" );
}